

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O0

string * __thiscall KeyValueFile::trimStr(KeyValueFile *this,string *s)

{
  int iVar1;
  char *pcVar2;
  ulong in_RDX;
  KeyValueFile *in_RSI;
  string *in_RDI;
  int to;
  int from;
  bool local_5a;
  bool local_59;
  allocator local_35 [20];
  allocator local_21;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  local_20 = std::__cxx11::string::length();
  do {
    local_20 = local_20 + -1;
    local_59 = false;
    if (0 < local_20) {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RDX);
      local_59 = isSpace(in_RSI,*pcVar2);
    }
  } while (local_59 != false);
  while( true ) {
    local_5a = false;
    if (local_1c <= local_20) {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RDX);
      local_5a = isSpace(in_RSI,*pcVar2);
    }
    if (local_5a == false) break;
    local_1c = local_1c + 1;
  }
  if (local_20 < local_1c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDX);
    iVar1 = local_20 - local_1c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar2,(long)(iVar1 + 1),local_35);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  return in_RDI;
}

Assistant:

std::string trimStr(std::string s)
  {
    int from = 0;
    int to = int(s.length()) - 1;
    while (to > 0 && isSpace(s[to]))
      to--;
    while (from <= to && isSpace(s[from]))
      from++;
    if (to < from)
      return std::string("");
    return std::string(&(s[from]), to - from + 1);
  }